

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O3

MsgType * FIX::identifyType(MsgType *__return_storage_ptr__,string *message)

{
  long lVar1;
  MessageParseError *pMVar2;
  string value;
  string local_48;
  
  lVar1 = std::__cxx11::string::find((char *)message,0x2b896b,0);
  if (lVar1 == -1) {
    pMVar2 = (MessageParseError *)__cxa_allocate_exception(0x50);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
    MessageParseError::MessageParseError(pMVar2,&local_48);
    __cxa_throw(pMVar2,&MessageParseError::typeinfo,Exception::~Exception);
  }
  lVar1 = std::__cxx11::string::find((char)message,1);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)message);
    (__return_storage_ptr__->super_StringField).super_FieldBase._vptr_FieldBase =
         (_func_int **)&PTR__FieldBase_00320f80;
    (__return_storage_ptr__->super_StringField).super_FieldBase.m_tag = 0x23;
    (__return_storage_ptr__->super_StringField).super_FieldBase.m_string._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->super_StringField).super_FieldBase.m_string.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(__return_storage_ptr__->super_StringField).super_FieldBase.m_string,
               local_48._M_dataplus._M_p,local_48._M_dataplus._M_p + local_48._M_string_length);
    (__return_storage_ptr__->super_StringField).super_FieldBase.m_data._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->super_StringField).super_FieldBase.m_data.field_2;
    (__return_storage_ptr__->super_StringField).super_FieldBase.m_data._M_string_length = 0;
    (__return_storage_ptr__->super_StringField).super_FieldBase.m_data.field_2._M_local_buf[0] =
         '\0';
    (__return_storage_ptr__->super_StringField).super_FieldBase.m_metrics.m_length = 0;
    (__return_storage_ptr__->super_StringField).super_FieldBase.m_metrics.m_checksum = 0;
    (__return_storage_ptr__->super_StringField).super_FieldBase._vptr_FieldBase =
         (_func_int **)&PTR__FieldBase_003259a8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    return __return_storage_ptr__;
  }
  pMVar2 = (MessageParseError *)__cxa_allocate_exception(0x50);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  MessageParseError::MessageParseError(pMVar2,&local_48);
  __cxa_throw(pMVar2,&MessageParseError::typeinfo,Exception::~Exception);
}

Assistant:

EXCEPT(MessageParseError) {
  std::string::size_type pos = message.find("\001"
                                            "35=");
  if (pos == std::string::npos) {
    throw MessageParseError();
  }

  std::string::size_type startValue = pos + 4;
  std::string::size_type soh = message.find_first_of('\001', startValue);
  if (soh == std::string::npos) {
    throw MessageParseError();
  }

  std::string value = message.substr(startValue, soh - startValue);
  return MsgType(value);
}